

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void xmlFormatError(xmlError *err,xmlGenericErrorFunc channel,void *data)

{
  uint uVar1;
  int iVar2;
  xmlErrorLevel xVar3;
  xmlChar *str;
  void *pvVar4;
  xmlParserInputPtr pxVar5;
  int iVar6;
  int iVar7;
  int local_11c;
  undefined1 local_118 [4];
  int i_1;
  xmlChar buf [150];
  int local_78;
  int i;
  int len;
  xmlParserInputPtr cur;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  xmlErrorLevel level;
  xmlNodePtr node;
  xmlChar *name;
  int domain;
  int code;
  int line;
  char *file;
  char *message;
  void *data_local;
  xmlGenericErrorFunc channel_local;
  xmlError *err_local;
  
  node = (xmlNodePtr)0x0;
  input = (xmlParserInputPtr)0x0;
  cur = (xmlParserInputPtr)0x0;
  _i = (xmlParserInputPtr)0x0;
  if ((err != (xmlError *)0x0) && (channel != (xmlGenericErrorFunc)0x0)) {
    str = (xmlChar *)err->message;
    uVar1 = err->line;
    iVar2 = err->code;
    iVar7 = err->domain;
    xVar3 = err->level;
    pvVar4 = err->node;
    if (iVar2 != 0) {
      if ((((iVar7 == 1) || (iVar7 == 5)) || (iVar7 == 4)) ||
         (((iVar7 == 3 || (iVar7 == 8)) || (iVar7 == 0x17)))) {
        input = (xmlParserInputPtr)err->ctxt;
      }
      if (((pvVar4 != (void *)0x0) && (*(int *)((long)pvVar4 + 8) == 1)) && (iVar7 != 0x11)) {
        node = *(xmlNodePtr *)((long)pvVar4 + 0x10);
      }
      if ((input == (xmlParserInputPtr)0x0) || (*(long *)&input->col == 0)) {
        if (err->file == (char *)0x0) {
          if ((uVar1 != 0) &&
             ((((iVar7 == 1 || (iVar7 == 0x11)) || (iVar7 == 0x10)) ||
              (((iVar7 == 4 || (iVar7 == 0x12)) || (iVar7 == 0x13)))))) {
            (*channel)(data,"Entity: line %d: ",(ulong)uVar1);
          }
        }
        else {
          (*channel)(data,"%s:%d: ",err->file,(ulong)uVar1);
        }
      }
      else {
        pxVar5 = *(xmlParserInputPtr *)&input->col;
        cur = pxVar5;
        if ((pxVar5->filename == (char *)0x0) && (1 < (int)input->consumed)) {
          cur = *(xmlParserInputPtr *)(input->free + (long)((int)input->consumed + -2) * 8);
          _i = pxVar5;
        }
        if (cur->filename == (char *)0x0) {
          if ((uVar1 != 0) && (iVar7 == 1)) {
            (*channel)(data,"Entity: line %d: ",(ulong)(uint)cur->line);
          }
        }
        else {
          (*channel)(data,"%s:%d: ",cur->filename,(ulong)(uint)cur->line);
        }
      }
      if (node != (xmlNodePtr)0x0) {
        (*channel)(data,"element %s: ",node);
      }
      switch(iVar7) {
      case 1:
        (*channel)(data,"parser ");
        break;
      default:
        break;
      case 3:
        (*channel)(data,"namespace ");
        break;
      case 4:
      case 0x17:
        (*channel)(data,"validity ");
        break;
      case 5:
        (*channel)(data,"HTML parser ");
        break;
      case 6:
        (*channel)(data,"memory ");
        break;
      case 7:
        (*channel)(data,"output ");
        break;
      case 8:
        (*channel)(data,"I/O ");
        break;
      case 0xb:
        (*channel)(data,"XInclude ");
        break;
      case 0xc:
        (*channel)(data,"XPath ");
        break;
      case 0xd:
        (*channel)(data,"parser ");
        break;
      case 0xe:
        (*channel)(data,"regexp ");
        break;
      case 0x10:
        (*channel)(data,"Schemas parser ");
        break;
      case 0x11:
        (*channel)(data,"Schemas validity ");
        break;
      case 0x12:
        (*channel)(data,"Relax-NG parser ");
        break;
      case 0x13:
        (*channel)(data,"Relax-NG validity ");
        break;
      case 0x14:
        (*channel)(data,"Catalog ");
        break;
      case 0x15:
        (*channel)(data,"C14N ");
        break;
      case 0x16:
        (*channel)(data,"XSLT ");
        break;
      case 0x1a:
        (*channel)(data,"module ");
        break;
      case 0x1b:
        (*channel)(data,"encoding ");
        break;
      case 0x1c:
        (*channel)(data,"schematron ");
        break;
      case 0x1d:
        (*channel)(data,"internal buffer ");
        break;
      case 0x1e:
        (*channel)(data,"URI ");
      }
      switch(xVar3) {
      case XML_ERR_NONE:
        (*channel)(data,": ");
        break;
      case XML_ERR_WARNING:
        (*channel)(data,"warning : ");
        break;
      case XML_ERR_ERROR:
        (*channel)(data,"error : ");
        break;
      case XML_ERR_FATAL:
        (*channel)(data,"error : ");
      }
      if (str == (xmlChar *)0x0) {
        (*channel)(data,"%s\n","No error message provided");
      }
      else {
        iVar6 = xmlStrlen(str);
        if ((iVar6 < 1) || (str[iVar6 + -1] == '\n')) {
          (*channel)(data,"%s",str);
        }
        else {
          (*channel)(data,"%s\n",str);
        }
      }
      if (input != (xmlParserInputPtr)0x0) {
        if ((cur != (xmlParserInputPtr)0x0) &&
           ((((cur->buf == (xmlParserInputBufferPtr)0x0 ||
              (cur->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) && (iVar2 == 0x51)) &&
            (cur->cur < cur->end)))) {
          (*channel)(data,"Bytes:");
          for (local_78 = 0; (local_78 < 4 && (cur->cur + local_78 < cur->end));
              local_78 = local_78 + 1) {
            (*channel)(data," 0x%02X",(ulong)cur->cur[local_78]);
          }
          (*channel)(data,"\n");
        }
        xmlParserPrintFileContextInternal(cur,channel,data);
        if (_i != (xmlParserInputPtr)0x0) {
          if (_i->filename == (char *)0x0) {
            if ((uVar1 != 0) && (iVar7 == 1)) {
              (*channel)(data,"Entity: line %d: \n",(ulong)(uint)_i->line);
            }
          }
          else {
            (*channel)(data,"%s:%d: \n",_i->filename,(ulong)(uint)_i->line);
          }
          xmlParserPrintFileContextInternal(_i,channel,data);
        }
      }
      if ((((iVar7 == 0xc) && (err->str1 != (char *)0x0)) && (err->int1 < 100)) &&
         (iVar2 = err->int1, iVar7 = xmlStrlen((xmlChar *)err->str1), iVar2 < iVar7)) {
        (*channel)(data,"%s\n",err->str1);
        for (local_11c = 0; local_11c < err->int1; local_11c = local_11c + 1) {
          local_118[local_11c] = 0x20;
        }
        local_118[local_11c] = 0x5e;
        local_118[local_11c + 1] = 0;
        (*channel)(data,"%s\n",local_118);
      }
    }
  }
  return;
}

Assistant:

void
xmlFormatError(const xmlError *err, xmlGenericErrorFunc channel, void *data)
{
    const char *message;
    const char *file;
    int line;
    int code;
    int domain;
    const xmlChar *name = NULL;
    xmlNodePtr node;
    xmlErrorLevel level;
    xmlParserCtxtPtr ctxt = NULL;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;

    if ((err == NULL) || (channel == NULL))
        return;

    message = err->message;
    file = err->file;
    line = err->line;
    code = err->code;
    domain = err->domain;
    level = err->level;
    node = err->node;

    if (code == XML_ERR_OK)
        return;

    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = err->ctxt;
    }

    if ((node != NULL) && (node->type == XML_ELEMENT_NODE) &&
        (domain != XML_FROM_SCHEMASV))
        name = node->name;

    /*
     * Maintain the compatibility with the legacy error handling
     */
    if ((ctxt != NULL) && (ctxt->input != NULL)) {
        input = ctxt->input;
        if ((input->filename == NULL) &&
            (ctxt->inputNr > 1)) {
            cur = input;
            input = ctxt->inputTab[ctxt->inputNr - 2];
        }
        if (input->filename)
            channel(data, "%s:%d: ", input->filename, input->line);
        else if ((line != 0) && (domain == XML_FROM_PARSER))
            channel(data, "Entity: line %d: ", input->line);
    } else {
        if (file != NULL)
            channel(data, "%s:%d: ", file, line);
        else if ((line != 0) &&
	         ((domain == XML_FROM_PARSER) || (domain == XML_FROM_SCHEMASV)||
		  (domain == XML_FROM_SCHEMASP)||(domain == XML_FROM_DTD) ||
		  (domain == XML_FROM_RELAXNGP)||(domain == XML_FROM_RELAXNGV)))
            channel(data, "Entity: line %d: ", line);
    }
    if (name != NULL) {
        channel(data, "element %s: ", name);
    }
    switch (domain) {
        case XML_FROM_PARSER:
            channel(data, "parser ");
            break;
        case XML_FROM_NAMESPACE:
            channel(data, "namespace ");
            break;
        case XML_FROM_DTD:
        case XML_FROM_VALID:
            channel(data, "validity ");
            break;
        case XML_FROM_HTML:
            channel(data, "HTML parser ");
            break;
        case XML_FROM_MEMORY:
            channel(data, "memory ");
            break;
        case XML_FROM_OUTPUT:
            channel(data, "output ");
            break;
        case XML_FROM_IO:
            channel(data, "I/O ");
            break;
        case XML_FROM_XINCLUDE:
            channel(data, "XInclude ");
            break;
        case XML_FROM_XPATH:
            channel(data, "XPath ");
            break;
        case XML_FROM_XPOINTER:
            channel(data, "parser ");
            break;
        case XML_FROM_REGEXP:
            channel(data, "regexp ");
            break;
        case XML_FROM_MODULE:
            channel(data, "module ");
            break;
        case XML_FROM_SCHEMASV:
            channel(data, "Schemas validity ");
            break;
        case XML_FROM_SCHEMASP:
            channel(data, "Schemas parser ");
            break;
        case XML_FROM_RELAXNGP:
            channel(data, "Relax-NG parser ");
            break;
        case XML_FROM_RELAXNGV:
            channel(data, "Relax-NG validity ");
            break;
        case XML_FROM_CATALOG:
            channel(data, "Catalog ");
            break;
        case XML_FROM_C14N:
            channel(data, "C14N ");
            break;
        case XML_FROM_XSLT:
            channel(data, "XSLT ");
            break;
        case XML_FROM_I18N:
            channel(data, "encoding ");
            break;
        case XML_FROM_SCHEMATRONV:
            channel(data, "schematron ");
            break;
        case XML_FROM_BUFFER:
            channel(data, "internal buffer ");
            break;
        case XML_FROM_URI:
            channel(data, "URI ");
            break;
        default:
            break;
    }
    switch (level) {
        case XML_ERR_NONE:
            channel(data, ": ");
            break;
        case XML_ERR_WARNING:
            channel(data, "warning : ");
            break;
        case XML_ERR_ERROR:
            channel(data, "error : ");
            break;
        case XML_ERR_FATAL:
            channel(data, "error : ");
            break;
    }
    if (message != NULL) {
        int len;
	len = xmlStrlen((const xmlChar *) message);
	if ((len > 0) && (message[len - 1] != '\n'))
	    channel(data, "%s\n", message);
	else
	    channel(data, "%s", message);
    } else {
        channel(data, "%s\n", "No error message provided");
    }

    if (ctxt != NULL) {
        if ((input != NULL) &&
            ((input->buf == NULL) || (input->buf->encoder == NULL)) &&
            (code == XML_ERR_INVALID_ENCODING) &&
            (input->cur < input->end)) {
            int i;

            channel(data, "Bytes:");
            for (i = 0; i < 4; i++) {
                if (input->cur + i >= input->end)
                    break;
                channel(data, " 0x%02X", input->cur[i]);
            }
            channel(data, "\n");
        }

        xmlParserPrintFileContextInternal(input, channel, data);

        if (cur != NULL) {
            if (cur->filename)
                channel(data, "%s:%d: \n", cur->filename, cur->line);
            else if ((line != 0) && (domain == XML_FROM_PARSER))
                channel(data, "Entity: line %d: \n", cur->line);
            xmlParserPrintFileContextInternal(cur, channel, data);
        }
    }
    if ((domain == XML_FROM_XPATH) && (err->str1 != NULL) &&
        (err->int1 < 100) &&
	(err->int1 < xmlStrlen((const xmlChar *)err->str1))) {
	xmlChar buf[150];
	int i;

	channel(data, "%s\n", err->str1);
	for (i=0;i < err->int1;i++)
	     buf[i] = ' ';
	buf[i++] = '^';
	buf[i] = 0;
	channel(data, "%s\n", buf);
    }
}